

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Gen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint fXor;
  uint uVar3;
  uint fVerbose;
  undefined4 extraout_var;
  Gia_Man_t *pNew;
  char *pcVar4;
  char *pcVar5;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  undefined8 local_40;
  
  local_68 = 0;
  Extra_UtilGetoptReset();
  local_54 = 1;
  local_58 = 8;
  local_60 = 0x100;
  local_64 = 6;
  local_5c = 0;
  local_40 = 0;
  fXor = 1;
  fVerbose = 0;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"AKNDLBMxvh"), iVar1 = globalUtilOptind, 0x75 < iVar2)
    {
      if (iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      else {
        if (iVar2 != 0x78) goto switchD_00293977_caseD_43;
        fXor = fXor ^ 1;
      }
    }
    switch(iVar2) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
LAB_00293b43:
        Abc_Print(-1,pcVar4);
        goto switchD_00293977_caseD_43;
      }
      local_68 = atoi(argv[globalUtilOptind]);
      uVar3 = local_68;
      break;
    case 0x42:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar3 = local_54;
      break;
    case 0x43:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
      goto switchD_00293977_caseD_43;
    case 0x44:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      local_58 = atoi(argv[globalUtilOptind]);
      uVar3 = local_58;
      break;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      local_64 = atoi(argv[globalUtilOptind]);
      uVar3 = local_64;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      local_5c = atoi(argv[globalUtilOptind]);
      uVar3 = local_5c;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_40 = CONCAT44(extraout_var,uVar3);
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_00293b43;
      }
      local_60 = atoi(argv[globalUtilOptind]);
      uVar3 = local_60;
      break;
    default:
      if (iVar2 == -1) {
        pNew = Extra_CommandGen(local_68,local_64,local_60,local_58,local_5c,local_54,(int)local_40,
                                fXor,fVerbose);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      goto switchD_00293977_caseD_43;
    }
    globalUtilOptind = iVar1 + 1;
  } while (-1 < (int)uVar3);
switchD_00293977_caseD_43:
  Abc_Print(-2,"usage: &gen [-AKNDLBMxvh]\n");
  Abc_Print(-2,"\t          generates network\n");
  Abc_Print(-2,"\t-A num  : the generation algorithm [default = %d]\n",(ulong)local_68);
  Abc_Print(-2,"\t-K num  : the number of LUT inputs [default = %d]\n",(ulong)local_64);
  Abc_Print(-2,"\t-N num  : the number of LUTs on one level [default = %d]\n",(ulong)local_60);
  Abc_Print(-2,"\t-D num  : the number of LUT levels [default = %d]\n",(ulong)local_58);
  Abc_Print(-2,"\t-L num  : limit below which we randomize [default = %d]\n",(ulong)local_5c);
  Abc_Print(-2,"\t-B num  : select best fanins among this many tries [default = %d]\n",
            (ulong)local_54);
  Abc_Print(-2,"\t-M num  : the multiplier type (1=array, 2=booth) [default = %d]\n",local_40);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (fXor == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-x      : toggle using XOR gates [default = %s]\n",pcVar4);
  if (fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Gen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Extra_CommandGen( int Algo, int LutSize, int nLuts, int nLevels, int Limit, int nBestTries, int Multi, int fXor, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int Algo        =   0;
    int LutSize     =   6;
    int nLuts       = 256;
    int nLevels     =   8;
    int Limit       =   0;
    int nBestTries  =   1;
    int Multi       =   0;
    int fXor        =   1;
    int c, fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AKNDLBMxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Algo < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            LutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLuts < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBestTries = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBestTries < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            Multi = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Multi < 0 )
                goto usage;
            break;
        case 'x':
            fXor ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pTemp = Extra_CommandGen( Algo, LutSize, nLuts, nLevels, Limit, nBestTries, Multi, fXor, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &gen [-AKNDLBMxvh]\n" );
    Abc_Print( -2, "\t          generates network\n" );
    Abc_Print( -2, "\t-A num  : the generation algorithm [default = %d]\n",                 Algo );
    Abc_Print( -2, "\t-K num  : the number of LUT inputs [default = %d]\n",                 LutSize );
    Abc_Print( -2, "\t-N num  : the number of LUTs on one level [default = %d]\n",          nLuts );
    Abc_Print( -2, "\t-D num  : the number of LUT levels [default = %d]\n",                 nLevels );
    Abc_Print( -2, "\t-L num  : limit below which we randomize [default = %d]\n",           Limit );
    Abc_Print( -2, "\t-B num  : select best fanins among this many tries [default = %d]\n", nBestTries );
    Abc_Print( -2, "\t-M num  : the multiplier type (1=array, 2=booth) [default = %d]\n",   Multi );
    Abc_Print( -2, "\t-x      : toggle using XOR gates [default = %s]\n",                   fXor? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n",      fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}